

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O1

void __thiscall
DBaseStatusBar::DrSmallNumberOuter(DBaseStatusBar *this,int val,int x,int y,bool center)

{
  int iVar1;
  int iVar2;
  DFrameBuffer *pDVar3;
  FTexture *pFVar4;
  uint uVar5;
  uint uVar6;
  double y_00;
  
  pDVar3 = screen;
  uVar6 = 999;
  if (val < 999) {
    uVar6 = val;
  }
  y_00 = (double)y;
  uVar5 = (uint)center;
  if (val < 100) {
    if ((int)uVar6 < 10) goto LAB_004d19f9;
  }
  else {
    pFVar4 = FImageCollection::operator[](&this->Images,uVar6 / 100 + 0x17);
    DCanvas::DrawTexture((DCanvas *)pDVar3,pFVar4,(double)x,y_00,0x400013a6,(ulong)uVar5,0);
    uVar6 = uVar6 % 100;
  }
  pDVar3 = screen;
  iVar2 = (int)uVar6 >> 0x1f;
  iVar1 = (int)uVar6 / 10 + iVar2;
  pFVar4 = FImageCollection::operator[](&this->Images,(iVar1 - iVar2) + 0x17);
  DCanvas::DrawTexture((DCanvas *)pDVar3,pFVar4,(double)(x + 4),y_00,0x400013a6,(ulong)uVar5,0);
  uVar6 = uVar6 + (iVar1 - iVar2) * -10;
LAB_004d19f9:
  pDVar3 = screen;
  pFVar4 = FImageCollection::operator[](&this->Images,uVar6 + 0x17);
  DCanvas::DrawTexture((DCanvas *)pDVar3,pFVar4,(double)(x + 8),y_00,0x400013a6,(ulong)uVar5,0);
  return;
}

Assistant:

void DBaseStatusBar::DrSmallNumberOuter (int val, int x, int y, bool center) const
{
	int digit = 0;

	if (val > 999)
	{
		val = 999;
	}
	if (val > 99)
	{
		digit = val / 100;
		screen->DrawTexture (Images[imgSmNumbers + digit], x, y,
			DTA_HUDRules, center ? HUD_HorizCenter : HUD_Normal, TAG_DONE);
		val -= digit * 100;
	}
	if (val > 9 || digit)
	{
		digit = val / 10;
		screen->DrawTexture (Images[imgSmNumbers + digit], x+4, y,
			DTA_HUDRules, center ? HUD_HorizCenter : HUD_Normal, TAG_DONE);
		val -= digit * 10;
	}
	screen->DrawTexture (Images[imgSmNumbers + val], x+8, y,
		DTA_HUDRules, center ? HUD_HorizCenter : HUD_Normal, TAG_DONE);
}